

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O3

int rackH2(void)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  difference_type __n;
  long lVar5;
  int freq [27];
  
  freq[0x18] = 0;
  freq[0x19] = 0;
  freq[0x1a] = 0;
  freq[0x14] = 0;
  freq[0x15] = 0;
  freq[0x16] = 0;
  freq[0x17] = 0;
  freq[0x10] = 0;
  freq[0x11] = 0;
  freq[0x12] = 0;
  freq[0x13] = 0;
  freq[0xc] = 0;
  freq[0xd] = 0;
  freq[0xe] = 0;
  freq[0xf] = 0;
  freq[8] = 0;
  freq[9] = 0;
  freq[10] = 0;
  freq[0xb] = 0;
  freq[4] = 0;
  freq[5] = 0;
  freq[6] = 0;
  freq[7] = 0;
  freq[0] = 0;
  freq[1] = 0;
  freq[2] = 0;
  freq[3] = 0;
  lVar1 = (long)rack_size;
  for (lVar4 = lVar1; lVar4 != 0; lVar4 = lVar4 + -1) {
    freq[(long)rack[lVar4 + -1] + -0x41] = freq[(long)rack[lVar4 + -1] + -0x41] + 1;
  }
  lVar4 = 0;
  iVar2 = 0;
  do {
    iVar3 = freq[lVar4];
    if (iVar3 != 0) {
      iVar2 = iVar2 + (((iVar3 + -1) * H2[lVar4][1]) / 2 + H2[lVar4][0]) * iVar3;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1b);
  iVar3 = iVar2;
  if (rack_size != 0) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar5 = lVar5 + (ulong)(rack[lVar4] == 'U');
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
    if (lVar5 != 0) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        lVar4 = lVar4 + (ulong)(rack[lVar5] == 'Q');
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
      iVar3 = iVar2 + 0x5dc;
      if (lVar4 == 0) {
        iVar3 = iVar2;
      }
    }
  }
  iVar2 = ~((freq[4] + freq[0] + freq[8] + freq[0xe] + freq[0x14]) * 2) + rack_size;
  return iVar2 * iVar2 * -0x32 + iVar3;
}

Assistant:

int rackH2() {
    int sum = 0;
    int freq[27];
    for (int i = 27; i--;) freq[i] = 0;
    for (int i = rack_size; i--;) {
        freq[rack[i] - 'A']++;
    }
    for (char c = 'A'; c <= 'A' + 26; c++) {
        if (freq[c - 'A'])
            sum += freq[c - 'A'] * (H2[c - 'A'][0] + (freq[c - 'A'] - 1) * H2[c - 'A'][1] / 2);
    }
    if (std::count(rack, rack + rack_size, 'U') && std::count(rack, rack + rack_size, 'Q')) sum += 1500;

    // vowels: A,E,I,O,U
    int num_vowels = freq[0] + freq['E' - 'A'] + freq['I' - 'A'] + freq['O' - 'A'] + freq['U' - 'A'];
    // consonants - vowels balance
    int bal = rack_size - num_vowels * 2 - 1; // ideally 3 vowels and 4 consonants
    sum -= bal * bal * 50; // max -2450 for 6 vowel leave
    return sum;
}